

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendOperator(ScriptBuilder *this,ScriptType type)

{
  uchar local_9;
  
  local_9 = (uchar)type;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->script_byte_array_,&local_9);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendOperator(ScriptType type) {
  script_byte_array_.push_back(type);
  return *this;
}